

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData * cfd::core::HashUtil::Sha512(ByteData *__return_storage_ptr__,Pubkey *pubkey)

{
  ByteData local_30;
  Pubkey *local_18;
  Pubkey *pubkey_local;
  
  local_18 = pubkey;
  pubkey_local = (Pubkey *)__return_storage_ptr__;
  Pubkey::GetData(&local_30,pubkey);
  Sha512(__return_storage_ptr__,&local_30);
  ByteData::~ByteData((ByteData *)0x409204);
  return __return_storage_ptr__;
}

Assistant:

ByteData HashUtil::Sha512(const Pubkey &pubkey) {
  return Sha512(pubkey.GetData());
}